

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_inl.h
# Opt level: O1

char * __thiscall
google::protobuf::internal::ExtensionSet::
ParseFieldWithExtensionInfo<google::protobuf::internal::InternalMetadataWithArena>
          (ExtensionSet *this,int number,bool was_packed_on_wire,ExtensionInfo *extension,
          InternalMetadataWithArena *metadata,char *ptr,ParseContext *ctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  byte bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  pair<const_char_*,_unsigned_long> pVar9;
  bool bVar10;
  int iVar11;
  LogMessage *other;
  string *s;
  MessageLite *pMVar13;
  void *pvVar14;
  char *pcVar15;
  undefined4 extraout_var;
  uint uVar12;
  ulong uVar16;
  undefined7 in_register_00000011;
  FieldType FVar17;
  uint32 uVar18;
  UnknownFieldSet *this_00;
  FieldDescriptor *pFVar19;
  pair<const_char_*,_int> pVar20;
  pair<const_char_*,_unsigned_long> pVar21;
  pair<const_char_*,_unsigned_long> pVar22;
  pair<const_char_*,_unsigned_long> pVar23;
  pair<const_char_*,_unsigned_long> pVar24;
  pair<const_char_*,_unsigned_long> pVar25;
  LogFinisher local_69;
  LogMessage local_68;
  
  FVar17 = extension->type;
  if ((int)CONCAT71(in_register_00000011,was_packed_on_wire) != 0) {
    switch(FVar17) {
    case '\x01':
      pvVar14 = MutableRawRepeatedField
                          (this,number,FVar17,extension->is_packed,extension->descriptor);
      pcVar15 = PackedDoubleParser(pvVar14,ptr,ctx);
      return pcVar15;
    case '\x02':
      pvVar14 = MutableRawRepeatedField
                          (this,number,FVar17,extension->is_packed,extension->descriptor);
      pcVar15 = PackedFloatParser(pvVar14,ptr,ctx);
      return pcVar15;
    case '\x03':
      pvVar14 = MutableRawRepeatedField
                          (this,number,FVar17,extension->is_packed,extension->descriptor);
      pcVar15 = PackedInt64Parser(pvVar14,ptr,ctx);
      return pcVar15;
    case '\x04':
      pvVar14 = MutableRawRepeatedField
                          (this,number,FVar17,extension->is_packed,extension->descriptor);
      pcVar15 = PackedUInt64Parser(pvVar14,ptr,ctx);
      return pcVar15;
    case '\x05':
      pvVar14 = MutableRawRepeatedField
                          (this,number,FVar17,extension->is_packed,extension->descriptor);
      pcVar15 = PackedInt32Parser(pvVar14,ptr,ctx);
      return pcVar15;
    case '\x06':
      pvVar14 = MutableRawRepeatedField
                          (this,number,FVar17,extension->is_packed,extension->descriptor);
      pcVar15 = PackedFixed64Parser(pvVar14,ptr,ctx);
      return pcVar15;
    case '\a':
      pvVar14 = MutableRawRepeatedField
                          (this,number,FVar17,extension->is_packed,extension->descriptor);
      pcVar15 = PackedFixed32Parser(pvVar14,ptr,ctx);
      return pcVar15;
    case '\b':
      pvVar14 = MutableRawRepeatedField
                          (this,number,FVar17,extension->is_packed,extension->descriptor);
      pcVar15 = PackedBoolParser(pvVar14,ptr,ctx);
      return pcVar15;
    case '\t':
    case '\n':
    case '\v':
    case '\f':
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/extension_set_inl.h"
                 ,0x4e);
      other = LogMessage::operator<<(&local_68,"Non-primitive types can\'t be packed.");
      LogFinisher::operator=(&local_69,other);
      LogMessage::~LogMessage(&local_68);
      return ptr;
    case '\r':
      pvVar14 = MutableRawRepeatedField
                          (this,number,FVar17,extension->is_packed,extension->descriptor);
      pcVar15 = PackedUInt32Parser(pvVar14,ptr,ctx);
      return pcVar15;
    case '\x0e':
      pvVar14 = MutableRawRepeatedField
                          (this,number,FVar17,extension->is_packed,extension->descriptor);
      pcVar15 = PackedEnumParserArg(pvVar14,ptr,ctx,
                                    (_func_bool_void_ptr_int *)
                                    (extension->field_3).enum_validity_check.func,
                                    (extension->field_3).enum_validity_check.arg,metadata,number);
      return pcVar15;
    case '\x0f':
      pvVar14 = MutableRawRepeatedField
                          (this,number,FVar17,extension->is_packed,extension->descriptor);
      pcVar15 = PackedSFixed32Parser(pvVar14,ptr,ctx);
      return pcVar15;
    case '\x10':
      pvVar14 = MutableRawRepeatedField
                          (this,number,FVar17,extension->is_packed,extension->descriptor);
      pcVar15 = PackedSFixed64Parser(pvVar14,ptr,ctx);
      return pcVar15;
    case '\x11':
      pvVar14 = MutableRawRepeatedField
                          (this,number,FVar17,extension->is_packed,extension->descriptor);
      pcVar15 = PackedSInt32Parser(pvVar14,ptr,ctx);
      return pcVar15;
    case '\x12':
      pvVar14 = MutableRawRepeatedField
                          (this,number,FVar17,extension->is_packed,extension->descriptor);
      pcVar15 = PackedSInt64Parser(pvVar14,ptr,ctx);
      return pcVar15;
    default:
      return ptr;
    }
  }
  switch(FVar17) {
  case '\x01':
    if (extension->is_repeated == true) {
      AddDouble(this,number,'\x01',extension->is_packed,*(double *)ptr,extension->descriptor);
      return ptr + 8;
    }
    SetDouble(this,number,'\x01',*(double *)ptr,extension->descriptor);
    return ptr + 8;
  case '\x02':
    if (extension->is_repeated == true) {
      AddFloat(this,number,'\x02',extension->is_packed,*(float *)ptr,extension->descriptor);
      return ptr + 4;
    }
    SetFloat(this,number,'\x02',*(float *)ptr,extension->descriptor);
    return ptr + 4;
  case '\x03':
    bVar3 = *ptr;
    pVar22.second = (long)(char)bVar3;
    pVar22.first = ptr + 1;
    if ((long)(char)bVar3 < 0) {
      bVar4 = ptr[1];
      uVar18 = ((uint)bVar3 + (uint)bVar4 * 0x80) - 0x80;
      if ((char)bVar4 < '\0') {
        pVar22 = VarintParseSlow64(ptr,uVar18);
      }
      else {
        pVar22.second._0_4_ = uVar18;
        pVar22.first = ptr + 2;
        pVar22.second._4_4_ = 0;
      }
    }
    if (pVar22.first != (char *)0x0) {
      if (extension->is_repeated == true) {
        bVar10 = extension->is_packed;
        pFVar19 = extension->descriptor;
        FVar17 = '\x03';
        goto LAB_0035a5c3;
      }
      pFVar19 = extension->descriptor;
      FVar17 = '\x03';
LAB_0035a5e0:
      pcVar15 = pVar22.first;
      SetInt64(this,number,FVar17,pVar22.second,pFVar19);
LAB_0035a669:
      if (pcVar15 != (char *)0x0) {
        return pcVar15;
      }
    }
    break;
  case '\x04':
    bVar3 = *ptr;
    pVar23.second = (long)(char)bVar3;
    pVar23.first = ptr + 1;
    if ((long)(char)bVar3 < 0) {
      bVar4 = ptr[1];
      uVar18 = ((uint)bVar3 + (uint)bVar4 * 0x80) - 0x80;
      if ((char)bVar4 < '\0') {
        pVar23 = VarintParseSlow64(ptr,uVar18);
      }
      else {
        pVar23.second._0_4_ = uVar18;
        pVar23.first = ptr + 2;
        pVar23.second._4_4_ = 0;
      }
    }
    pcVar15 = pVar23.first;
    if (pcVar15 != (char *)0x0) {
      if (extension->is_repeated == true) {
        AddUInt64(this,number,'\x04',extension->is_packed,pVar23.second,extension->descriptor);
      }
      else {
        SetUInt64(this,number,'\x04',pVar23.second,extension->descriptor);
      }
      goto LAB_0035a669;
    }
    break;
  case '\x05':
    bVar3 = *ptr;
    auVar6._8_8_ = (long)(char)bVar3;
    auVar6._0_8_ = ptr + 1;
    auVar8 = auVar6._0_12_;
    if ((long)(char)bVar3 < 0) {
      bVar4 = ptr[1];
      uVar18 = ((uint)bVar3 + (uint)bVar4 * 0x80) - 0x80;
      if ((char)bVar4 < '\0') {
        pVar24 = VarintParseSlow64(ptr,uVar18);
        auVar8 = pVar24._0_12_;
      }
      else {
        auVar8._8_4_ = uVar18;
        auVar8._0_8_ = ptr + 2;
      }
    }
    pcVar15 = auVar8._0_8_;
    uVar12 = auVar8._8_4_;
    if (pcVar15 != (char *)0x0) {
      if (extension->is_repeated == true) {
        bVar10 = extension->is_packed;
        pFVar19 = extension->descriptor;
        FVar17 = '\x05';
        goto LAB_0035a4a8;
      }
      pFVar19 = extension->descriptor;
      FVar17 = '\x05';
LAB_0035a4c5:
      SetInt32(this,number,FVar17,uVar12,pFVar19);
      goto LAB_0035a669;
    }
    break;
  case '\x06':
    if (extension->is_repeated == true) {
      AddUInt64(this,number,'\x06',extension->is_packed,*(uint64 *)ptr,extension->descriptor);
      return ptr + 8;
    }
    SetUInt64(this,number,'\x06',*(uint64 *)ptr,extension->descriptor);
    return ptr + 8;
  case '\a':
    if (extension->is_repeated == true) {
      AddUInt32(this,number,'\a',extension->is_packed,*(uint32 *)ptr,extension->descriptor);
      return ptr + 4;
    }
    SetUInt32(this,number,'\a',*(uint32 *)ptr,extension->descriptor);
    return ptr + 4;
  case '\b':
    if (extension->is_repeated == true) {
      AddBool(this,number,'\b',extension->is_packed,(bool)(*ptr & 1),extension->descriptor);
      return ptr + 1;
    }
    SetBool(this,number,'\b',(bool)(*ptr & 1),extension->descriptor);
    return ptr + 1;
  case '\t':
  case '\f':
    if (extension->is_repeated == true) {
      s = AddString_abi_cxx11_(this,number,'\t',extension->descriptor);
    }
    else {
      s = MutableString_abi_cxx11_(this,number,'\t',extension->descriptor);
    }
    bVar3 = *ptr;
    uVar12 = (uint)bVar3;
    if ((char)bVar3 < '\0') {
      pVar20 = ReadSizeFallback(ptr,(uint)bVar3);
      uVar12 = pVar20.second;
      pcVar15 = pVar20.first;
    }
    else {
      pcVar15 = ptr + 1;
    }
    if (pcVar15 != (char *)0x0) {
      pcVar15 = EpsCopyInputStream::ReadString(&ctx->super_EpsCopyInputStream,pcVar15,uVar12,s);
      return pcVar15;
    }
    break;
  case '\n':
    pMVar13 = (MessageLite *)(extension->field_3).enum_validity_check.func;
    if (extension->is_repeated == true) {
      pMVar13 = AddMessage(this,number,'\n',pMVar13,extension->descriptor);
    }
    else {
      pMVar13 = MutableMessage(this,number,'\n',pMVar13,extension->descriptor);
    }
    iVar11 = ctx->depth_;
    ctx->depth_ = iVar11 + -1;
    if (0 < iVar11) {
      ctx->group_depth_ = ctx->group_depth_ + 1;
      iVar11 = (*pMVar13->_vptr_MessageLite[0xd])(pMVar13,ptr,ctx);
      uVar1 = ctx->depth_;
      uVar2 = ctx->group_depth_;
      ctx->depth_ = uVar1 + 1;
      ctx->group_depth_ = uVar2 + -1;
      uVar18 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
      if (uVar18 != number * 8 + 3U) {
        return (char *)0x0;
      }
      return (char *)CONCAT44(extraout_var,iVar11);
    }
    break;
  case '\v':
    pMVar13 = (MessageLite *)(extension->field_3).enum_validity_check.func;
    if (extension->is_repeated == true) {
      pMVar13 = AddMessage(this,number,'\v',pMVar13,extension->descriptor);
    }
    else {
      pMVar13 = MutableMessage(this,number,'\v',pMVar13,extension->descriptor);
    }
    pcVar15 = ParseContext::ParseMessage(ctx,pMVar13,ptr);
    return pcVar15;
  case '\r':
    bVar3 = *ptr;
    auVar5._8_8_ = (long)(char)bVar3;
    auVar5._0_8_ = ptr + 1;
    auVar7 = auVar5._0_12_;
    if ((long)(char)bVar3 < 0) {
      bVar4 = ptr[1];
      uVar18 = ((uint)bVar3 + (uint)bVar4 * 0x80) - 0x80;
      if ((char)bVar4 < '\0') {
        pVar24 = VarintParseSlow64(ptr,uVar18);
        auVar7 = pVar24._0_12_;
      }
      else {
        auVar7._8_4_ = uVar18;
        auVar7._0_8_ = ptr + 2;
      }
    }
    pcVar15 = auVar7._0_8_;
    if (pcVar15 != (char *)0x0) {
      if (extension->is_repeated == true) {
        AddUInt32(this,number,'\r',extension->is_packed,auVar7._8_4_,extension->descriptor);
      }
      else {
        SetUInt32(this,number,'\r',auVar7._8_4_,extension->descriptor);
      }
      goto LAB_0035a669;
    }
    break;
  case '\x0e':
    bVar3 = *ptr;
    pVar25.second = (long)(char)bVar3;
    pVar25.first = ptr + 1;
    if ((long)(char)bVar3 < 0) {
      bVar4 = ptr[1];
      uVar18 = ((uint)bVar3 + (uint)bVar4 * 0x80) - 0x80;
      if ((char)bVar4 < '\0') {
        pVar25 = VarintParseSlow64(ptr,uVar18);
      }
      else {
        pVar25.second._0_4_ = uVar18;
        pVar25.first = ptr + 2;
        pVar25.second._4_4_ = 0;
      }
    }
    pcVar15 = pVar25.first;
    if (pcVar15 != (char *)0x0) {
      iVar11 = (int)pVar25.second;
      bVar10 = (*(extension->field_3).enum_validity_check.func)
                         ((extension->field_3).enum_validity_check.arg,iVar11);
      if (bVar10) {
        if (extension->is_repeated == true) {
          AddEnum(this,number,'\x0e',extension->is_packed,iVar11,extension->descriptor);
        }
        else {
          SetEnum(this,number,'\x0e',iVar11,extension->descriptor);
        }
      }
      else {
        pvVar14 = (metadata->
                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  ).ptr_;
        if (((ulong)pvVar14 & 1) == 0) {
          this_00 = InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                    ::mutable_unknown_fields_slow
                              (&metadata->
                                super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                              );
        }
        else {
          this_00 = (UnknownFieldSet *)((ulong)pvVar14 & 0xfffffffffffffffe);
        }
        UnknownFieldSet::AddVarint(this_00,number,pVar25.second);
      }
      goto LAB_0035a669;
    }
    break;
  case '\x0f':
    if (extension->is_repeated == true) {
      AddInt32(this,number,'\x0f',extension->is_packed,*(int32 *)ptr,extension->descriptor);
      return ptr + 4;
    }
    SetInt32(this,number,'\x0f',*(int32 *)ptr,extension->descriptor);
    return ptr + 4;
  case '\x10':
    if (extension->is_repeated == true) {
      AddInt64(this,number,'\x10',extension->is_packed,*(int64 *)ptr,extension->descriptor);
      return ptr + 8;
    }
    SetInt64(this,number,'\x10',*(int64 *)ptr,extension->descriptor);
    return ptr + 8;
  case '\x11':
    bVar3 = *ptr;
    pVar21.second = (long)(char)bVar3;
    pVar21.first = ptr + 1;
    if ((long)(char)bVar3 < 0) {
      bVar4 = ptr[1];
      uVar18 = ((uint)bVar3 + (uint)bVar4 * 0x80) - 0x80;
      if ((char)bVar4 < '\0') {
        pVar21 = VarintParseSlow64(ptr,uVar18);
      }
      else {
        pVar21.second._0_4_ = uVar18;
        pVar21.first = ptr + 2;
        pVar21.second._4_4_ = 0;
      }
    }
    pcVar15 = pVar21.first;
    if (pcVar15 != (char *)0x0) {
      uVar12 = -((uint)pVar21.second & 1) ^ (uint)(pVar21.second >> 1) & 0x7fffffff;
      if (extension->is_repeated != true) {
        pFVar19 = extension->descriptor;
        FVar17 = '\x11';
        goto LAB_0035a4c5;
      }
      bVar10 = extension->is_packed;
      pFVar19 = extension->descriptor;
      FVar17 = '\x11';
LAB_0035a4a8:
      AddInt32(this,number,FVar17,bVar10,uVar12,pFVar19);
      goto LAB_0035a669;
    }
    break;
  case '\x12':
    bVar3 = *ptr;
    pVar24.second = (long)(char)bVar3;
    pVar24.first = ptr + 1;
    if ((long)(char)bVar3 < 0) {
      bVar4 = ptr[1];
      uVar18 = ((uint)bVar3 + (uint)bVar4 * 0x80) - 0x80;
      if ((char)bVar4 < '\0') {
        pVar24 = VarintParseSlow64(ptr,uVar18);
      }
      else {
        pVar24.second._0_4_ = uVar18;
        pVar24.first = ptr + 2;
        pVar24.second._4_4_ = 0;
      }
    }
    pcVar15 = pVar24.first;
    if (pcVar15 != (char *)0x0) {
      uVar16 = -(ulong)((uint)pVar24.second & 1) ^ pVar24.second >> 1;
      pVar9.second = uVar16;
      pVar9.first = pcVar15;
      pVar22.second = uVar16;
      pVar22.first = pcVar15;
      if (extension->is_repeated != true) {
        pFVar19 = extension->descriptor;
        FVar17 = '\x12';
        goto LAB_0035a5e0;
      }
      bVar10 = extension->is_packed;
      pFVar19 = extension->descriptor;
      FVar17 = '\x12';
      pVar22 = pVar9;
LAB_0035a5c3:
      pcVar15 = pVar22.first;
      AddInt64(this,number,FVar17,bVar10,pVar22.second,pFVar19);
      goto LAB_0035a669;
    }
    break;
  default:
    goto switchD_00359b3e_default;
  }
  ptr = (char *)0x0;
switchD_00359b3e_default:
  return ptr;
}

Assistant:

const char* ExtensionSet::ParseFieldWithExtensionInfo(
    int number, bool was_packed_on_wire, const ExtensionInfo& extension,
    T* metadata, const char* ptr, internal::ParseContext* ctx) {
  if (was_packed_on_wire) {
    switch (extension.type) {
#define HANDLE_TYPE(UPPERCASE, CPP_CAMELCASE)                                \
  case WireFormatLite::TYPE_##UPPERCASE:                                     \
    return internal::Packed##CPP_CAMELCASE##Parser(                          \
        MutableRawRepeatedField(number, extension.type, extension.is_packed, \
                                extension.descriptor),                       \
        ptr, ctx);
      HANDLE_TYPE(INT32, Int32);
      HANDLE_TYPE(INT64, Int64);
      HANDLE_TYPE(UINT32, UInt32);
      HANDLE_TYPE(UINT64, UInt64);
      HANDLE_TYPE(SINT32, SInt32);
      HANDLE_TYPE(SINT64, SInt64);
      HANDLE_TYPE(FIXED32, Fixed32);
      HANDLE_TYPE(FIXED64, Fixed64);
      HANDLE_TYPE(SFIXED32, SFixed32);
      HANDLE_TYPE(SFIXED64, SFixed64);
      HANDLE_TYPE(FLOAT, Float);
      HANDLE_TYPE(DOUBLE, Double);
      HANDLE_TYPE(BOOL, Bool);
#undef HANDLE_TYPE

      case WireFormatLite::TYPE_ENUM:
        return internal::PackedEnumParserArg(
            MutableRawRepeatedField(number, extension.type, extension.is_packed,
                                    extension.descriptor),
            ptr, ctx, extension.enum_validity_check.func,
            extension.enum_validity_check.arg, metadata, number);
      case WireFormatLite::TYPE_STRING:
      case WireFormatLite::TYPE_BYTES:
      case WireFormatLite::TYPE_GROUP:
      case WireFormatLite::TYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Non-primitive types can't be packed.";
        break;
    }
  } else {
    switch (extension.type) {
#define HANDLE_VARINT_TYPE(UPPERCASE, CPP_CAMELCASE)                        \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    uint64 value;                                                           \
    ptr = VarintParse(ptr, &value);                                         \
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);                                    \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_VARINT_TYPE(INT32, Int32);
      HANDLE_VARINT_TYPE(INT64, Int64);
      HANDLE_VARINT_TYPE(UINT32, UInt32);
      HANDLE_VARINT_TYPE(UINT64, UInt64);
#undef HANDLE_VARINT_TYPE
#define HANDLE_SVARINT_TYPE(UPPERCASE, CPP_CAMELCASE, SIZE)                 \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    uint64 val;                                                             \
    ptr = VarintParse(ptr, &val);                                           \
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);                                    \
    auto value = WireFormatLite::ZigZagDecode##SIZE(val);                   \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_SVARINT_TYPE(SINT32, Int32, 32);
      HANDLE_SVARINT_TYPE(SINT64, Int64, 64);
#undef HANDLE_SVARINT_TYPE
#define HANDLE_FIXED_TYPE(UPPERCASE, CPP_CAMELCASE, CPPTYPE)                \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    auto value = UnalignedLoad<CPPTYPE>(ptr);                               \
    ptr += sizeof(CPPTYPE);                                                 \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_FIXED_TYPE(FIXED32, UInt32, uint32);
      HANDLE_FIXED_TYPE(FIXED64, UInt64, uint64);
      HANDLE_FIXED_TYPE(SFIXED32, Int32, int32);
      HANDLE_FIXED_TYPE(SFIXED64, Int64, int64);
      HANDLE_FIXED_TYPE(FLOAT, Float, float);
      HANDLE_FIXED_TYPE(DOUBLE, Double, double);
      HANDLE_FIXED_TYPE(BOOL, Bool, bool);
#undef HANDLE_FIXED_TYPE

      case WireFormatLite::TYPE_ENUM: {
        uint64 val;
        ptr = VarintParse(ptr, &val);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        int value = val;

        if (!extension.enum_validity_check.func(
                extension.enum_validity_check.arg, value)) {
          WriteVarint(number, val, metadata->mutable_unknown_fields());
        } else if (extension.is_repeated) {
          AddEnum(number, WireFormatLite::TYPE_ENUM, extension.is_packed, value,
                  extension.descriptor);
        } else {
          SetEnum(number, WireFormatLite::TYPE_ENUM, value,
                  extension.descriptor);
        }
        break;
      }

      case WireFormatLite::TYPE_BYTES:
      case WireFormatLite::TYPE_STRING: {
        std::string* value =
            extension.is_repeated
                ? AddString(number, WireFormatLite::TYPE_STRING,
                            extension.descriptor)
                : MutableString(number, WireFormatLite::TYPE_STRING,
                                extension.descriptor);
        int size = ReadSize(&ptr);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        return ctx->ReadString(ptr, size, value);
      }

      case WireFormatLite::TYPE_GROUP: {
        MessageLite* value =
            extension.is_repeated
                ? AddMessage(number, WireFormatLite::TYPE_GROUP,
                             *extension.message_info.prototype,
                             extension.descriptor)
                : MutableMessage(number, WireFormatLite::TYPE_GROUP,
                                 *extension.message_info.prototype,
                                 extension.descriptor);
        uint32 tag = (number << 3) + WireFormatLite::WIRETYPE_START_GROUP;
        return ctx->ParseGroup(value, ptr, tag);
      }

      case WireFormatLite::TYPE_MESSAGE: {
        MessageLite* value =
            extension.is_repeated
                ? AddMessage(number, WireFormatLite::TYPE_MESSAGE,
                             *extension.message_info.prototype,
                             extension.descriptor)
                : MutableMessage(number, WireFormatLite::TYPE_MESSAGE,
                                 *extension.message_info.prototype,
                                 extension.descriptor);
        return ctx->ParseMessage(value, ptr);
      }
    }
  }
  return ptr;
}